

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VXPrintf(StrAccum *pAccum,int useExtended,char *fmt,__va_list_tag *ap)

{
  double x;
  etByte eVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  double dVar7;
  bool bVar8;
  uint uVar9;
  double dVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  undefined8 *puVar14;
  ulong *puVar15;
  uint *puVar16;
  double *pdVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  byte *pbVar21;
  ulong uVar22;
  ulong uVar23;
  byte bVar24;
  int iVar25;
  long *plVar26;
  int *piVar27;
  uint uVar28;
  byte *pbVar29;
  uint uVar30;
  char *pcVar31;
  long lVar32;
  char cVar33;
  byte *pbVar34;
  int iVar35;
  ulong uVar36;
  char *pcVar37;
  byte *pbVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  double dVar42;
  byte local_112;
  byte *local_100;
  ulong local_c0;
  char buf [70];
  
  pcVar31 = (char *)0x0;
LAB_0013433e:
  pbVar21 = (byte *)fmt;
  if (*fmt != 0x25) {
    if (*fmt == 0) {
      return;
    }
    for (lVar20 = 1; (bVar24 = ((byte *)fmt)[lVar20], bVar24 != 0 && (bVar24 != 0x25));
        lVar20 = lVar20 + 1) {
    }
    sqlite3StrAccumAppend(pAccum,fmt,(int)lVar20);
    if (bVar24 == 0) {
      return;
    }
    pbVar21 = (byte *)fmt + lVar20;
    pcVar31 = fmt;
  }
  bVar24 = pbVar21[1];
  if (bVar24 == 0) {
    sqlite3StrAccumAppend(pAccum,"%",1);
switchD_00134584_default:
    return;
  }
  bVar6 = false;
  iVar13 = 0;
  bVar5 = false;
  bVar39 = false;
  bVar40 = false;
  bVar8 = false;
  pbVar21 = pbVar21 + 2;
  do {
    pbVar38 = pbVar21;
    if (bVar24 == 0x20) {
      bVar39 = true;
    }
    else if (bVar24 == 0x21) {
      iVar13 = 1;
    }
    else if (bVar24 == 0x23) {
      bVar5 = true;
    }
    else if (bVar24 == 0x30) {
      bVar6 = true;
    }
    else if (bVar24 == 0x2d) {
      bVar8 = true;
    }
    else {
      if (bVar24 != 0x2b) {
        if (bVar24 != 0x2a) {
          iVar25 = (int)(char)bVar24;
          pbVar38 = pbVar38 + -1;
          goto LAB_001343fc;
        }
        uVar28 = ap->gp_offset;
        if ((ulong)uVar28 < 0x29) {
          puVar16 = (uint *)((ulong)uVar28 + (long)ap->reg_save_area);
          ap->gp_offset = uVar28 + 8;
        }
        else {
          puVar16 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar16 + 2;
        }
        uVar28 = *puVar16;
        if ((int)uVar28 < 0) {
          bVar8 = true;
        }
        uVar4 = -uVar28;
        if (0 < (int)uVar28) {
          uVar4 = uVar28;
        }
        uVar36 = (ulong)uVar4;
        iVar25 = (int)(char)*pbVar38;
        goto LAB_0013446c;
      }
      bVar40 = true;
    }
    bVar24 = *pbVar38;
    pbVar21 = pbVar38 + 1;
  } while (bVar24 != 0);
  iVar25 = 0;
LAB_001343fc:
  uVar36 = 0;
  while (iVar25 - 0x30U < 10) {
    pbVar21 = pbVar38 + 1;
    pbVar38 = pbVar38 + 1;
    uVar36 = (ulong)((iVar25 - 0x30U) + (int)uVar36 * 10);
    iVar25 = (int)(char)*pbVar21;
  }
LAB_0013446c:
  iVar35 = (int)uVar36;
  if (iVar25 == 0x2e) {
    bVar24 = pbVar38[1];
    if (bVar24 == 0x2a) {
      uVar28 = ap->gp_offset;
      if ((ulong)uVar28 < 0x29) {
        puVar16 = (uint *)((ulong)uVar28 + (long)ap->reg_save_area);
        ap->gp_offset = uVar28 + 8;
      }
      else {
        puVar16 = (uint *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar16 + 2;
      }
      uVar28 = *puVar16;
      uVar4 = -uVar28;
      if (0 < (int)uVar28) {
        uVar4 = uVar28;
      }
      uVar22 = (ulong)uVar4;
      iVar25 = (int)(char)pbVar38[2];
      pbVar38 = pbVar38 + 2;
    }
    else {
      uVar22 = 0;
      pbVar21 = pbVar38;
      while( true ) {
        pbVar38 = pbVar21 + 1;
        iVar25 = (int)(char)bVar24;
        if (9 < (byte)(bVar24 - 0x30)) break;
        uVar22 = (ulong)(((int)uVar22 * 10 + iVar25) - 0x30);
        bVar24 = pbVar21[2];
        pbVar21 = pbVar38;
      }
    }
  }
  else {
    uVar22 = 0xffffffff;
  }
  iVar19 = (int)uVar22;
  if (iVar25 == 0x6c) {
    iVar25 = (int)(char)pbVar38[1];
    if (iVar25 == 0x6c) {
      iVar25 = (int)(char)pbVar38[2];
      pbVar38 = pbVar38 + 2;
      bVar41 = true;
      bVar3 = true;
    }
    else {
      pbVar38 = pbVar38 + 1;
      bVar3 = true;
      bVar41 = false;
    }
  }
  else {
    bVar41 = false;
    bVar3 = false;
  }
  lVar20 = 0;
  do {
    lVar32 = lVar20;
    if (lVar32 + 6 == 0x90) {
      return;
    }
    lVar20 = lVar32 + 6;
  } while (iVar25 != (&fmtinfo[0].fmttype)[lVar32]);
  if ((useExtended == 0) && (((&fmtinfo[0].flags)[lVar32] & 2) != 0)) {
    return;
  }
  eVar1 = (&fmtinfo[0].type)[lVar32];
  switch(eVar1) {
  case '\x01':
  case '\x10':
    goto switchD_00134584_caseD_1;
  case '\x02':
  case '\x03':
  case '\x04':
    uVar28 = ap->fp_offset;
    if ((ulong)uVar28 < 0xa1) {
      pdVar17 = (double *)((ulong)uVar28 + (long)ap->reg_save_area);
      ap->fp_offset = uVar28 + 0x10;
    }
    else {
      pdVar17 = (double *)ap->overflow_arg_area;
      ap->overflow_arg_area = pdVar17 + 1;
    }
    x = *pdVar17;
    if (iVar19 < 0) {
      iVar19 = 6;
    }
    if (0.0 <= x) {
      if (bVar40) {
        local_112 = 0x2b;
        pcVar31 = "+Inf";
        goto LAB_00134766;
      }
      bVar39 = !bVar39;
      local_c0 = (ulong)!bVar39;
      local_112 = !bVar39 << 5;
      pcVar31 = "Inf";
    }
    else {
      x = -x;
      local_112 = 0x2d;
      pcVar31 = "-Inf";
LAB_00134766:
      bVar39 = false;
      local_c0 = 1;
    }
    dVar42 = 0.5;
    iVar19 = iVar19 - (uint)(0 < iVar19 && eVar1 == '\x04');
    for (iVar25 = iVar19; 0 < iVar25; iVar25 = iVar25 + -1) {
      dVar42 = dVar42 * 0.1;
    }
    if (eVar1 == '\x02') {
      x = dVar42 + x;
    }
    iVar25 = sqlite3IsNaN(x);
    if (iVar25 == 0) {
      uVar22 = 0;
      if (0.0 < x) {
        uVar22 = 0xffffffffffffffff;
        uVar28 = 0xffffff9c;
        uVar4 = 0xffffffc0;
        uVar9 = 0xfffffff8;
        dVar7 = 1.0;
        do {
          uVar30 = uVar9;
          uVar12 = uVar4;
          uVar18 = uVar22 & 0xffffffff;
          dVar10 = dVar7;
          if (x < dVar7 * 1e+100) break;
          uVar28 = uVar28 + 100;
          uVar22 = (ulong)((int)uVar22 + 100);
          uVar4 = uVar12 + 100;
          uVar9 = uVar30 + 100;
          dVar7 = dVar7 * 1e+100;
        } while (uVar28 < 0x15f);
        do {
          dVar7 = dVar10;
          uVar28 = uVar30;
          uVar23 = uVar18;
          if (x < dVar7 * 1e+64) break;
          uVar12 = uVar12 + 0x40;
          uVar18 = (ulong)((int)uVar23 + 0x40);
          uVar30 = uVar28 + 0x40;
          dVar10 = dVar7 * 1e+64;
        } while (uVar12 < 0x15f);
        do {
          uVar22 = uVar23;
          dVar10 = dVar7;
          if (x < dVar7 * 100000000.0) break;
          uVar28 = uVar28 + 8;
          uVar23 = (ulong)((int)uVar22 + 8);
          dVar7 = dVar7 * 100000000.0;
        } while (uVar28 < 0x15f);
        do {
          dVar7 = dVar10;
          uVar28 = (int)uVar22 + 1;
          uVar22 = (ulong)uVar28;
          dVar10 = dVar7 * 10.0;
          if (x < dVar10) break;
        } while (uVar28 < 0x15f);
        for (x = x / dVar7; x < 1e-08; x = x * 100000000.0) {
          uVar22 = (ulong)((int)uVar22 - 8);
        }
        for (; x < 1.0; x = x * 10.0) {
          uVar22 = (ulong)((int)uVar22 - 1);
        }
        if (0x15e < (int)uVar22) {
          uVar28 = sqlite3Strlen30(pcVar31);
          local_100 = (byte *)0x0;
          uVar18 = (ulong)uVar28;
          break;
        }
      }
      cVar33 = (char)iVar13;
      if (eVar1 == '\x02') {
LAB_00134d10:
        bVar40 = cVar33 != '\0';
        bVar41 = eVar1 == '\x03';
        uVar28 = (uint)uVar22;
        if (bVar41) {
          uVar28 = 0;
        }
      }
      else {
        dVar42 = x + dVar42;
        x = dVar42;
        if (dVar42 >= 10.0) {
          x = dVar42 * 0.1;
        }
        uVar28 = ((int)uVar22 + 1) - (uint)(dVar42 < 10.0);
        uVar22 = (ulong)uVar28;
        if (eVar1 != '\x04') goto LAB_00134d10;
        bVar40 = !bVar5;
        bVar41 = iVar19 < (int)uVar28 || (int)uVar28 < -4;
        if (iVar19 < (int)uVar28 || (int)uVar28 < -4) {
          uVar28 = 0;
        }
        iVar19 = iVar19 - uVar28;
      }
      iVar25 = iVar19 + iVar35 + uVar28;
      if (iVar25 < 0x38) {
        local_100 = (byte *)0x0;
        pcVar31 = buf;
      }
      else {
        local_100 = (byte *)sqlite3Malloc(iVar25 + 0xf);
        pcVar31 = (char *)local_100;
        if (local_100 == (byte *)0x0) goto LAB_0013527a;
      }
      bVar3 = 0 < iVar19;
      pbVar21 = (byte *)pcVar31;
      if (!bVar39) {
        pbVar21 = (byte *)pcVar31 + 1;
        *pcVar31 = local_112;
      }
      iVar13 = iVar13 * 10 + 0x10;
      if ((int)uVar28 < 0) {
        *pbVar21 = 0x30;
        pbVar21 = pbVar21 + 1;
        iVar25 = uVar28 + 1;
      }
      else {
        for (; -1 < (int)uVar28; uVar28 = uVar28 - 1) {
          if (iVar13 < 1) {
            bVar24 = 0x30;
          }
          else {
            dVar42 = ROUND(x);
            iVar13 = iVar13 + -1;
            x = (x - (double)(int)dVar42) * 10.0;
            bVar24 = (char)(int)dVar42 + 0x30;
          }
          *pbVar21 = bVar24;
          pbVar21 = pbVar21 + 1;
        }
        iVar25 = 0;
      }
      if ((bVar5 || cVar33 != '\0') || bVar3) {
        *pbVar21 = 0x2e;
        pbVar21 = pbVar21 + 1;
      }
      pbVar29 = pbVar21 + -1;
      for (; iVar25 < 0; iVar25 = iVar25 + 1) {
        *pbVar21 = 0x30;
        pbVar21 = pbVar21 + 1;
        iVar19 = iVar19 + -1;
        pbVar29 = pbVar29 + 1;
      }
      for (; 0 < iVar19; iVar19 = iVar19 + -1) {
        if (iVar13 < 1) {
          bVar24 = 0x30;
        }
        else {
          dVar42 = ROUND(x);
          iVar13 = iVar13 + -1;
          x = (x - (double)(int)dVar42) * 10.0;
          bVar24 = (char)(int)dVar42 + 0x30;
        }
        *pbVar21 = bVar24;
        pbVar21 = pbVar21 + 1;
        pbVar29 = pbVar29 + 1;
      }
      if ((bool)(bVar40 & ((bVar5 || cVar33 != '\0') || bVar3))) {
        for (; *pbVar29 == 0x30; pbVar29 = pbVar29 + -1) {
          *pbVar29 = 0;
        }
        if (*pbVar29 == 0x2e) {
          if (cVar33 == '\0') {
            *pbVar29 = 0;
            pbVar21 = pbVar29;
          }
          else {
            pbVar29[1] = 0x30;
            pbVar21 = pbVar29 + 2;
          }
        }
        else {
          pbVar21 = pbVar29 + 1;
        }
      }
      if (bVar41) {
        *pbVar21 = "0123456789ABCDEF0123456789abcdef"[(&fmtinfo[0].charset)[lVar32]];
        uVar18 = (ulong)(uint)-(int)uVar22;
        if (0 < (int)uVar22) {
          uVar18 = uVar22;
        }
        pbVar21[1] = (char)(uVar22 >> 0x1f) * '\x02' + 0x2b;
        if ((uint)uVar18 < 100) {
          pbVar21 = pbVar21 + 2;
        }
        else {
          uVar22 = uVar18 / 100;
          uVar18 = uVar18 % 100;
          pbVar21[2] = (char)uVar22 + 0x30;
          pbVar21 = pbVar21 + 3;
        }
        uVar11 = (ushort)uVar18 & 0xff;
        *pbVar21 = (byte)(uVar11 / 10) | 0x30;
        pbVar21[1] = (byte)(uVar11 % 10) | 0x30;
        pbVar21 = pbVar21 + 2;
      }
      *pbVar21 = 0;
      uVar28 = (int)pbVar21 - (int)pcVar31;
      uVar18 = (ulong)uVar28;
      if (((bVar6) && (!bVar8)) && (iVar13 = iVar35 - uVar28, iVar13 != 0 && (int)uVar28 <= iVar35))
      {
        pbVar21 = (byte *)pcVar31 + (int)uVar28;
        for (lVar20 = (long)iVar35; iVar13 <= lVar20; lVar20 = lVar20 + -1) {
          ((byte *)pcVar31)[lVar20] = *pbVar21;
          pbVar21 = pbVar21 + -1;
        }
        for (lVar20 = 0; uVar18 = uVar36, iVar13 != (int)lVar20; lVar20 = lVar20 + 1) {
          ((byte *)pcVar31)[lVar20 + local_c0] = 0x30;
        }
      }
    }
    else {
      local_100 = (byte *)0x0;
      pcVar31 = "NaN";
      uVar18 = 3;
    }
    break;
  case '\x05':
    iVar13 = pAccum->nChar;
    uVar28 = ap->gp_offset;
    if ((ulong)uVar28 < 0x29) {
      puVar14 = (undefined8 *)((ulong)uVar28 + (long)ap->reg_save_area);
      ap->gp_offset = uVar28 + 8;
    }
    else {
      puVar14 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar14 + 1;
    }
    *(int *)*puVar14 = iVar13;
    local_100 = (byte *)0x0;
    iVar35 = 0;
    uVar18 = 0;
    break;
  case '\x06':
  case '\a':
    uVar28 = ap->gp_offset;
    if ((ulong)uVar28 < 0x29) {
      puVar14 = (undefined8 *)((ulong)uVar28 + (long)ap->reg_save_area);
      ap->gp_offset = uVar28 + 8;
    }
    else {
      puVar14 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar14 + 1;
    }
    pbVar21 = (byte *)*puVar14;
    local_100 = (byte *)0x0;
    if (eVar1 == '\a') {
      local_100 = pbVar21;
    }
    pcVar31 = (char *)pbVar21;
    if (pbVar21 == (byte *)0x0) {
      pcVar31 = "";
      local_100 = pbVar21;
    }
    if (iVar19 < 0) {
      uVar28 = sqlite3Strlen30(pcVar31);
      uVar18 = (ulong)uVar28;
    }
    else {
      for (uVar36 = 0;
          (uVar18 = uVar22, uVar22 != uVar36 && (uVar18 = uVar36, ((byte *)pcVar31)[uVar36] != 0));
          uVar36 = uVar36 + 1) {
      }
    }
    break;
  case '\b':
    buf[0] = '%';
LAB_00134c0e:
    local_100 = (byte *)0x0;
    pcVar31 = buf;
    uVar18 = 1;
    break;
  case '\t':
    uVar28 = ap->gp_offset;
    if ((ulong)uVar28 < 0x29) {
      pcVar31 = (char *)((ulong)uVar28 + (long)ap->reg_save_area);
      ap->gp_offset = uVar28 + 8;
    }
    else {
      pcVar31 = (char *)ap->overflow_arg_area;
      ap->overflow_arg_area = pcVar31 + 8;
    }
    buf[0] = *pcVar31;
    if (iVar19 < 0) goto LAB_00134c0e;
    for (uVar36 = 1; uVar36 < uVar22; uVar36 = uVar36 + 1) {
      buf[uVar36] = buf[0];
    }
    local_100 = (byte *)0x0;
    pcVar31 = buf;
    uVar18 = uVar22;
    break;
  case '\n':
  case '\v':
  case '\x0f':
    uVar28 = ap->gp_offset;
    if ((ulong)uVar28 < 0x29) {
      plVar26 = (long *)((ulong)uVar28 + (long)ap->reg_save_area);
      ap->gp_offset = uVar28 + 8;
    }
    else {
      plVar26 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar26 + 1;
    }
    bVar24 = (eVar1 != '\x0f') * '\x05' + 0x22;
    pcVar31 = (char *)*plVar26;
    pcVar37 = "(NULL)";
    if (eVar1 == '\v') {
      pcVar37 = "NULL";
    }
    if (pcVar31 != (char *)0x0) {
      pcVar37 = pcVar31;
    }
    iVar13 = 0;
    for (uVar36 = 0;
        (uVar23 = uVar22, iVar19 != (int)uVar36 && (uVar23 = uVar36, pcVar37[uVar36] != 0));
        uVar36 = uVar36 + 1) {
      iVar13 = iVar13 + (uint)(pcVar37[uVar36] == bVar24);
    }
    bVar39 = pcVar31 != (char *)0x0 && eVar1 == '\v';
    uVar28 = iVar13 + (int)uVar23 + (uint)bVar39 * 2 + 1;
    if (uVar28 < 0x47) {
      local_100 = (byte *)0x0;
      pcVar31 = buf;
    }
    else {
      local_100 = (byte *)sqlite3Malloc(uVar28);
      pcVar31 = (char *)local_100;
      if (local_100 == (byte *)0x0) {
        pAccum->mallocFailed = '\x01';
        return;
      }
    }
    if (bVar39) {
      *pcVar31 = 0x27;
    }
    uVar18 = (ulong)bVar39;
    uVar36 = 0;
    while( true ) {
      iVar13 = (int)uVar18;
      lVar20 = (long)iVar13;
      if ((uVar23 & 0xffffffff) == uVar36) break;
      bVar2 = pcVar37[uVar36];
      ((byte *)pcVar31)[lVar20] = bVar2;
      uVar18 = lVar20 + 1;
      if (bVar2 == bVar24) {
        ((byte *)pcVar31)[uVar18] = bVar24;
        uVar18 = (ulong)(iVar13 + 2);
      }
      uVar36 = uVar36 + 1;
      uVar18 = uVar18 & 0xffffffff;
    }
    if (bVar39) {
      uVar18 = (ulong)(iVar13 + 1);
      ((byte *)pcVar31)[lVar20] = 0x27;
    }
    ((byte *)pcVar31)[(int)uVar18] = 0;
    break;
  case '\f':
    uVar28 = ap->gp_offset;
    if ((ulong)uVar28 < 0x29) {
      plVar26 = (long *)((ulong)uVar28 + (long)ap->reg_save_area);
      ap->gp_offset = uVar28 + 8;
    }
    else {
      plVar26 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar26 + 1;
    }
    puVar14 = (undefined8 *)*plVar26;
    if (puVar14 != (undefined8 *)0x0) {
      sqlite3StrAccumAppend(pAccum,(char *)*puVar14,*(int *)(puVar14 + 1));
    }
    goto LAB_00134c67;
  case '\r':
    uVar28 = ap->gp_offset;
    uVar36 = (ulong)uVar28;
    if (uVar36 < 0x29) {
      ap->gp_offset = (uint)(uVar36 + 8);
      lVar20 = *(long *)((long)ap->reg_save_area + uVar36);
      if (0x20 < uVar28) goto LAB_00134b72;
      piVar27 = (int *)(uVar36 + 8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar28 + 0x10;
    }
    else {
      plVar26 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar26 + 1;
      lVar20 = *plVar26;
LAB_00134b72:
      piVar27 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar27 + 2;
    }
    iVar13 = *piVar27;
    pcVar37 = *(char **)(lVar20 + 0x10 + (long)iVar13 * 0x68);
    if (pcVar37 != (char *)0x0) {
      sqlite3StrAccumAppend(pAccum,pcVar37,-1);
      sqlite3StrAccumAppend(pAccum,".",1);
    }
    sqlite3StrAccumAppend(pAccum,*(char **)(lVar20 + (long)iVar13 * 0x68 + 0x18),-1);
LAB_00134c67:
    iVar35 = 0;
    local_100 = (byte *)0x0;
    uVar18 = 0;
    break;
  case '\x0e':
    bVar41 = true;
    bVar3 = true;
    goto switchD_00134584_caseD_1;
  default:
    goto switchD_00134584_default;
  }
LAB_001350fb:
  iVar13 = (int)uVar18;
  if ((!bVar8) && (iVar35 - iVar13 != 0 && iVar13 <= iVar35)) {
    sqlite3AppendSpace(pAccum,iVar35 - iVar13);
  }
  if (0 < iVar13) {
    sqlite3StrAccumAppend(pAccum,pcVar31,iVar13);
  }
  if ((bVar8) && (iVar35 - iVar13 != 0 && iVar13 <= iVar35)) {
    sqlite3AppendSpace(pAccum,iVar35 - iVar13);
  }
  sqlite3_free(local_100);
  fmt = (char *)(pbVar38 + 1);
  goto LAB_0013433e;
switchD_00134584_caseD_1:
  if (((&fmtinfo[0].flags)[lVar32] & 1) == 0) {
    if (bVar41) {
      uVar28 = ap->gp_offset;
      if ((ulong)uVar28 < 0x29) {
        puVar15 = (ulong *)((ulong)uVar28 + (long)ap->reg_save_area);
        ap->gp_offset = uVar28 + 8;
      }
      else {
        puVar15 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar15 + 1;
      }
      uVar36 = *puVar15;
    }
    else {
      uVar28 = ap->gp_offset;
      if (bVar3) {
        if (uVar28 < 0x29) {
          puVar15 = (ulong *)((long)ap->reg_save_area + (ulong)uVar28);
          ap->gp_offset = uVar28 + 8;
        }
        else {
          puVar15 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar15 + 1;
        }
        uVar36 = *puVar15;
      }
      else {
        if (uVar28 < 0x29) {
          puVar16 = (uint *)((ulong)uVar28 + (long)ap->reg_save_area);
          ap->gp_offset = uVar28 + 8;
        }
        else {
          puVar16 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar16 + 2;
        }
        uVar36 = (ulong)*puVar16;
      }
    }
    bVar24 = 0;
  }
  else {
    if (bVar41) {
      uVar28 = ap->gp_offset;
      if ((ulong)uVar28 < 0x29) {
        puVar15 = (ulong *)((ulong)uVar28 + (long)ap->reg_save_area);
        ap->gp_offset = uVar28 + 8;
      }
      else {
        puVar15 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar15 + 1;
      }
      uVar36 = *puVar15;
    }
    else {
      uVar28 = ap->gp_offset;
      if (bVar3) {
        if (uVar28 < 0x29) {
          puVar15 = (ulong *)((long)ap->reg_save_area + (ulong)uVar28);
          ap->gp_offset = uVar28 + 8;
        }
        else {
          puVar15 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar15 + 1;
        }
        uVar36 = *puVar15;
      }
      else {
        if (uVar28 < 0x29) {
          piVar27 = (int *)((ulong)uVar28 + (long)ap->reg_save_area);
          ap->gp_offset = uVar28 + 8;
        }
        else {
          piVar27 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar27 + 2;
        }
        uVar36 = (ulong)*piVar27;
      }
    }
    if ((long)uVar36 < 0) {
      uVar36 = -uVar36;
      bVar24 = 0x2d;
    }
    else {
      bVar24 = 0x2b;
      if (!bVar40) {
        bVar24 = bVar39 << 5;
      }
    }
  }
  iVar13 = iVar19;
  if ((bVar6) && (iVar13 = iVar35 + -1 + (uint)(bVar24 == 0), iVar13 < iVar19)) {
    iVar13 = iVar19;
  }
  if (iVar13 < 0x3c) {
    pbVar21 = (byte *)buf;
    iVar25 = 0x46;
    local_100 = (byte *)0x0;
  }
  else {
    iVar25 = iVar13 + 10;
    pbVar21 = (byte *)sqlite3Malloc(iVar25);
    local_100 = pbVar21;
    if (pbVar21 == (byte *)0x0) {
LAB_0013527a:
      pAccum->mallocFailed = '\x01';
      return;
    }
  }
  pbVar34 = pbVar21 + (iVar25 - 1);
  pbVar29 = pbVar34;
  if (eVar1 == '\x10') {
    uVar22 = uVar36 % 10;
    if ((uVar36 / 10) % 10 == 1) {
      uVar22 = 0;
    }
    if (3 < uVar36 % 10) {
      uVar22 = 0;
    }
    pbVar29 = pbVar34 + -2;
    *(undefined2 *)(pbVar34 + -2) = *(undefined2 *)("thstndrd" + uVar22 * 2);
  }
  bVar2 = (&fmtinfo[0].charset)[lVar32];
  uVar22 = (ulong)(&fmtinfo[0].base)[lVar32];
  iVar25 = iVar13 + (int)pbVar29;
  if (iVar13 < 0x3d) {
    iVar13 = 0x3c;
  }
  iVar13 = ((iVar25 - iVar13) - (int)pbVar21) + -9;
  uVar18 = uVar36;
  pbVar21 = pbVar29 + -2;
  do {
    pcVar31 = (char *)pbVar21;
    pbVar29[-1] = "0123456789ABCDEF0123456789abcdef"[uVar18 % uVar22 + (ulong)bVar2];
    pbVar29 = pbVar29 + -1;
    iVar13 = iVar13 + -1;
    bVar39 = uVar22 <= uVar18;
    uVar18 = uVar18 / uVar22;
    pbVar21 = (byte *)pcVar31 + -1;
  } while (bVar39);
  for (; 0 < iVar13; iVar13 = iVar13 + -1) {
    *pcVar31 = 0x30;
    pcVar31 = (char *)((byte *)pcVar31 + -1);
  }
  if (bVar24 == 0) {
    pcVar31 = (char *)((byte *)pcVar31 + 1);
  }
  else {
    *pcVar31 = bVar24;
  }
  if ((bVar5 && uVar36 != 0) && ((ulong)(&fmtinfo[0].prefix)[lVar32] != 0)) {
    for (pbVar21 = (byte *)("-x0" + (&fmtinfo[0].prefix)[lVar32]); *pbVar21 != 0;
        pbVar21 = pbVar21 + 1) {
      ((byte *)pcVar31)[-1] = *pbVar21;
      pcVar31 = (char *)((byte *)pcVar31 + -1);
    }
  }
  uVar18 = (ulong)(uint)((int)pbVar34 - (int)pcVar31);
  goto LAB_001350fb;
}

Assistant:

SQLITE_PRIVATE void sqlite3VXPrintf(
  StrAccum *pAccum,                  /* Accumulate results here */
  int useExtended,                   /* Allow extended %-conversions */
  const char *fmt,                   /* Format string */
  va_list ap                         /* arguments */
){
  int c;                     /* Next character in the format string */
  char *bufpt;               /* Pointer to the conversion buffer */
  int precision;             /* Precision of the current field */
  int length;                /* Length of the field */
  int idx;                   /* A general purpose loop counter */
  int width;                 /* Width of the current field */
  etByte flag_leftjustify;   /* True if "-" flag is present */
  etByte flag_plussign;      /* True if "+" flag is present */
  etByte flag_blanksign;     /* True if " " flag is present */
  etByte flag_alternateform; /* True if "#" flag is present */
  etByte flag_altform2;      /* True if "!" flag is present */
  etByte flag_zeropad;       /* True if field width constant starts with zero */
  etByte flag_long;          /* True if "l" flag is present */
  etByte flag_longlong;      /* True if the "ll" flag is present */
  etByte done;               /* Loop termination flag */
  etByte xtype = 0;          /* Conversion paradigm */
  char prefix;               /* Prefix character.  "+" or "-" or " " or '\0'. */
  sqlite_uint64 longvalue;   /* Value for integer types */
  LONGDOUBLE_TYPE realvalue; /* Value for real types */
  const et_info *infop;      /* Pointer to the appropriate info structure */
  char *zOut;                /* Rendering buffer */
  int nOut;                  /* Size of the rendering buffer */
  char *zExtra;              /* Malloced memory used by some conversion */
#ifndef SQLITE_OMIT_FLOATING_POINT
  int  exp, e2;              /* exponent of real numbers */
  int nsd;                   /* Number of significant digits returned */
  double rounder;            /* Used for rounding floating point values */
  etByte flag_dp;            /* True if decimal point should be shown */
  etByte flag_rtz;           /* True if trailing zeros should be removed */
#endif
  char buf[etBUFSIZE];       /* Conversion buffer */

  bufpt = 0;
  for(; (c=(*fmt))!=0; ++fmt){
    if( c!='%' ){
      int amt;
      bufpt = (char *)fmt;
      amt = 1;
      while( (c=(*++fmt))!='%' && c!=0 ) amt++;
      sqlite3StrAccumAppend(pAccum, bufpt, amt);
      if( c==0 ) break;
    }
    if( (c=(*++fmt))==0 ){
      sqlite3StrAccumAppend(pAccum, "%", 1);
      break;
    }
    /* Find out what flags are present */
    flag_leftjustify = flag_plussign = flag_blanksign = 
     flag_alternateform = flag_altform2 = flag_zeropad = 0;
    done = 0;
    do{
      switch( c ){
        case '-':   flag_leftjustify = 1;     break;
        case '+':   flag_plussign = 1;        break;
        case ' ':   flag_blanksign = 1;       break;
        case '#':   flag_alternateform = 1;   break;
        case '!':   flag_altform2 = 1;        break;
        case '0':   flag_zeropad = 1;         break;
        default:    done = 1;                 break;
      }
    }while( !done && (c=(*++fmt))!=0 );
    /* Get the field width */
    width = 0;
    if( c=='*' ){
      width = va_arg(ap,int);
      if( width<0 ){
        flag_leftjustify = 1;
        width = -width;
      }
      c = *++fmt;
    }else{
      while( c>='0' && c<='9' ){
        width = width*10 + c - '0';
        c = *++fmt;
      }
    }
    /* Get the precision */
    if( c=='.' ){
      precision = 0;
      c = *++fmt;
      if( c=='*' ){
        precision = va_arg(ap,int);
        if( precision<0 ) precision = -precision;
        c = *++fmt;
      }else{
        while( c>='0' && c<='9' ){
          precision = precision*10 + c - '0';
          c = *++fmt;
        }
      }
    }else{
      precision = -1;
    }
    /* Get the conversion type modifier */
    if( c=='l' ){
      flag_long = 1;
      c = *++fmt;
      if( c=='l' ){
        flag_longlong = 1;
        c = *++fmt;
      }else{
        flag_longlong = 0;
      }
    }else{
      flag_long = flag_longlong = 0;
    }
    /* Fetch the info entry for the field */
    infop = &fmtinfo[0];
    xtype = etINVALID;
    for(idx=0; idx<ArraySize(fmtinfo); idx++){
      if( c==fmtinfo[idx].fmttype ){
        infop = &fmtinfo[idx];
        if( useExtended || (infop->flags & FLAG_INTERN)==0 ){
          xtype = infop->type;
        }else{
          return;
        }
        break;
      }
    }
    zExtra = 0;

    /*
    ** At this point, variables are initialized as follows:
    **
    **   flag_alternateform          TRUE if a '#' is present.
    **   flag_altform2               TRUE if a '!' is present.
    **   flag_plussign               TRUE if a '+' is present.
    **   flag_leftjustify            TRUE if a '-' is present or if the
    **                               field width was negative.
    **   flag_zeropad                TRUE if the width began with 0.
    **   flag_long                   TRUE if the letter 'l' (ell) prefixed
    **                               the conversion character.
    **   flag_longlong               TRUE if the letter 'll' (ell ell) prefixed
    **                               the conversion character.
    **   flag_blanksign              TRUE if a ' ' is present.
    **   width                       The specified field width.  This is
    **                               always non-negative.  Zero is the default.
    **   precision                   The specified precision.  The default
    **                               is -1.
    **   xtype                       The class of the conversion.
    **   infop                       Pointer to the appropriate info struct.
    */
    switch( xtype ){
      case etPOINTER:
        flag_longlong = sizeof(char*)==sizeof(i64);
        flag_long = sizeof(char*)==sizeof(long int);
        /* Fall through into the next case */
      case etORDINAL:
      case etRADIX:
        if( infop->flags & FLAG_SIGNED ){
          i64 v;
          if( flag_longlong ){
            v = va_arg(ap,i64);
          }else if( flag_long ){
            v = va_arg(ap,long int);
          }else{
            v = va_arg(ap,int);
          }
          if( v<0 ){
            if( v==SMALLEST_INT64 ){
              longvalue = ((u64)1)<<63;
            }else{
              longvalue = -v;
            }
            prefix = '-';
          }else{
            longvalue = v;
            if( flag_plussign )        prefix = '+';
            else if( flag_blanksign )  prefix = ' ';
            else                       prefix = 0;
          }
        }else{
          if( flag_longlong ){
            longvalue = va_arg(ap,u64);
          }else if( flag_long ){
            longvalue = va_arg(ap,unsigned long int);
          }else{
            longvalue = va_arg(ap,unsigned int);
          }
          prefix = 0;
        }
        if( longvalue==0 ) flag_alternateform = 0;
        if( flag_zeropad && precision<width-(prefix!=0) ){
          precision = width-(prefix!=0);
        }
        if( precision<etBUFSIZE-10 ){
          nOut = etBUFSIZE;
          zOut = buf;
        }else{
          nOut = precision + 10;
          zOut = zExtra = sqlite3Malloc( nOut );
          if( zOut==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }
        bufpt = &zOut[nOut-1];
        if( xtype==etORDINAL ){
          static const char zOrd[] = "thstndrd";
          int x = (int)(longvalue % 10);
          if( x>=4 || (longvalue/10)%10==1 ){
            x = 0;
          }
          *(--bufpt) = zOrd[x*2+1];
          *(--bufpt) = zOrd[x*2];
        }
        {
          register const char *cset;      /* Use registers for speed */
          register int base;
          cset = &aDigits[infop->charset];
          base = infop->base;
          do{                                           /* Convert to ascii */
            *(--bufpt) = cset[longvalue%base];
            longvalue = longvalue/base;
          }while( longvalue>0 );
        }
        length = (int)(&zOut[nOut-1]-bufpt);
        for(idx=precision-length; idx>0; idx--){
          *(--bufpt) = '0';                             /* Zero pad */
        }
        if( prefix ) *(--bufpt) = prefix;               /* Add sign */
        if( flag_alternateform && infop->prefix ){      /* Add "0" or "0x" */
          const char *pre;
          char x;
          pre = &aPrefix[infop->prefix];
          for(; (x=(*pre))!=0; pre++) *(--bufpt) = x;
        }
        length = (int)(&zOut[nOut-1]-bufpt);
        break;
      case etFLOAT:
      case etEXP:
      case etGENERIC:
        realvalue = va_arg(ap,double);
#ifdef SQLITE_OMIT_FLOATING_POINT
        length = 0;
#else
        if( precision<0 ) precision = 6;         /* Set default precision */
        if( realvalue<0.0 ){
          realvalue = -realvalue;
          prefix = '-';
        }else{
          if( flag_plussign )          prefix = '+';
          else if( flag_blanksign )    prefix = ' ';
          else                         prefix = 0;
        }
        if( xtype==etGENERIC && precision>0 ) precision--;
#if 0
        /* Rounding works like BSD when the constant 0.4999 is used.  Wierd! */
        for(idx=precision, rounder=0.4999; idx>0; idx--, rounder*=0.1);
#else
        /* It makes more sense to use 0.5 */
        for(idx=precision, rounder=0.5; idx>0; idx--, rounder*=0.1){}
#endif
        if( xtype==etFLOAT ) realvalue += rounder;
        /* Normalize realvalue to within 10.0 > realvalue >= 1.0 */
        exp = 0;
        if( sqlite3IsNaN((double)realvalue) ){
          bufpt = "NaN";
          length = 3;
          break;
        }
        if( realvalue>0.0 ){
          LONGDOUBLE_TYPE scale = 1.0;
          while( realvalue>=1e100*scale && exp<=350 ){ scale *= 1e100;exp+=100;}
          while( realvalue>=1e64*scale && exp<=350 ){ scale *= 1e64; exp+=64; }
          while( realvalue>=1e8*scale && exp<=350 ){ scale *= 1e8; exp+=8; }
          while( realvalue>=10.0*scale && exp<=350 ){ scale *= 10.0; exp++; }
          realvalue /= scale;
          while( realvalue<1e-8 ){ realvalue *= 1e8; exp-=8; }
          while( realvalue<1.0 ){ realvalue *= 10.0; exp--; }
          if( exp>350 ){
            if( prefix=='-' ){
              bufpt = "-Inf";
            }else if( prefix=='+' ){
              bufpt = "+Inf";
            }else{
              bufpt = "Inf";
            }
            length = sqlite3Strlen30(bufpt);
            break;
          }
        }
        bufpt = buf;
        /*
        ** If the field type is etGENERIC, then convert to either etEXP
        ** or etFLOAT, as appropriate.
        */
        if( xtype!=etFLOAT ){
          realvalue += rounder;
          if( realvalue>=10.0 ){ realvalue *= 0.1; exp++; }
        }
        if( xtype==etGENERIC ){
          flag_rtz = !flag_alternateform;
          if( exp<-4 || exp>precision ){
            xtype = etEXP;
          }else{
            precision = precision - exp;
            xtype = etFLOAT;
          }
        }else{
          flag_rtz = flag_altform2;
        }
        if( xtype==etEXP ){
          e2 = 0;
        }else{
          e2 = exp;
        }
        if( e2+precision+width > etBUFSIZE - 15 ){
          bufpt = zExtra = sqlite3Malloc( e2+precision+width+15 );
          if( bufpt==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }
        zOut = bufpt;
        nsd = 16 + flag_altform2*10;
        flag_dp = (precision>0 ?1:0) | flag_alternateform | flag_altform2;
        /* The sign in front of the number */
        if( prefix ){
          *(bufpt++) = prefix;
        }
        /* Digits prior to the decimal point */
        if( e2<0 ){
          *(bufpt++) = '0';
        }else{
          for(; e2>=0; e2--){
            *(bufpt++) = et_getdigit(&realvalue,&nsd);
          }
        }
        /* The decimal point */
        if( flag_dp ){
          *(bufpt++) = '.';
        }
        /* "0" digits after the decimal point but before the first
        ** significant digit of the number */
        for(e2++; e2<0; precision--, e2++){
          assert( precision>0 );
          *(bufpt++) = '0';
        }
        /* Significant digits after the decimal point */
        while( (precision--)>0 ){
          *(bufpt++) = et_getdigit(&realvalue,&nsd);
        }
        /* Remove trailing zeros and the "." if no digits follow the "." */
        if( flag_rtz && flag_dp ){
          while( bufpt[-1]=='0' ) *(--bufpt) = 0;
          assert( bufpt>zOut );
          if( bufpt[-1]=='.' ){
            if( flag_altform2 ){
              *(bufpt++) = '0';
            }else{
              *(--bufpt) = 0;
            }
          }
        }
        /* Add the "eNNN" suffix */
        if( xtype==etEXP ){
          *(bufpt++) = aDigits[infop->charset];
          if( exp<0 ){
            *(bufpt++) = '-'; exp = -exp;
          }else{
            *(bufpt++) = '+';
          }
          if( exp>=100 ){
            *(bufpt++) = (char)((exp/100)+'0');        /* 100's digit */
            exp %= 100;
          }
          *(bufpt++) = (char)(exp/10+'0');             /* 10's digit */
          *(bufpt++) = (char)(exp%10+'0');             /* 1's digit */
        }
        *bufpt = 0;

        /* The converted number is in buf[] and zero terminated. Output it.
        ** Note that the number is in the usual order, not reversed as with
        ** integer conversions. */
        length = (int)(bufpt-zOut);
        bufpt = zOut;

        /* Special case:  Add leading zeros if the flag_zeropad flag is
        ** set and we are not left justified */
        if( flag_zeropad && !flag_leftjustify && length < width){
          int i;
          int nPad = width - length;
          for(i=width; i>=nPad; i--){
            bufpt[i] = bufpt[i-nPad];
          }
          i = prefix!=0;
          while( nPad-- ) bufpt[i++] = '0';
          length = width;
        }
#endif /* !defined(SQLITE_OMIT_FLOATING_POINT) */
        break;
      case etSIZE:
        *(va_arg(ap,int*)) = pAccum->nChar;
        length = width = 0;
        break;
      case etPERCENT:
        buf[0] = '%';
        bufpt = buf;
        length = 1;
        break;
      case etCHARX:
        c = va_arg(ap,int);
        buf[0] = (char)c;
        if( precision>=0 ){
          for(idx=1; idx<precision; idx++) buf[idx] = (char)c;
          length = precision;
        }else{
          length =1;
        }
        bufpt = buf;
        break;
      case etSTRING:
      case etDYNSTRING:
        bufpt = va_arg(ap,char*);
        if( bufpt==0 ){
          bufpt = "";
        }else if( xtype==etDYNSTRING ){
          zExtra = bufpt;
        }
        if( precision>=0 ){
          for(length=0; length<precision && bufpt[length]; length++){}
        }else{
          length = sqlite3Strlen30(bufpt);
        }
        break;
      case etSQLESCAPE:
      case etSQLESCAPE2:
      case etSQLESCAPE3: {
        int i, j, k, n, isnull;
        int needQuote;
        char ch;
        char q = ((xtype==etSQLESCAPE3)?'"':'\'');   /* Quote character */
        char *escarg = va_arg(ap,char*);
        isnull = escarg==0;
        if( isnull ) escarg = (xtype==etSQLESCAPE2 ? "NULL" : "(NULL)");
        k = precision;
        for(i=n=0; k!=0 && (ch=escarg[i])!=0; i++, k--){
          if( ch==q )  n++;
        }
        needQuote = !isnull && xtype==etSQLESCAPE2;
        n += i + 1 + needQuote*2;
        if( n>etBUFSIZE ){
          bufpt = zExtra = sqlite3Malloc( n );
          if( bufpt==0 ){
            pAccum->mallocFailed = 1;
            return;
          }
        }else{
          bufpt = buf;
        }
        j = 0;
        if( needQuote ) bufpt[j++] = q;
        k = i;
        for(i=0; i<k; i++){
          bufpt[j++] = ch = escarg[i];
          if( ch==q ) bufpt[j++] = ch;
        }
        if( needQuote ) bufpt[j++] = q;
        bufpt[j] = 0;
        length = j;
        /* The precision in %q and %Q means how many input characters to
        ** consume, not the length of the output...
        ** if( precision>=0 && precision<length ) length = precision; */
        break;
      }
      case etTOKEN: {
        Token *pToken = va_arg(ap, Token*);
        if( pToken ){
          sqlite3StrAccumAppend(pAccum, (const char*)pToken->z, pToken->n);
        }
        length = width = 0;
        break;
      }
      case etSRCLIST: {
        SrcList *pSrc = va_arg(ap, SrcList*);
        int k = va_arg(ap, int);
        struct SrcList_item *pItem = &pSrc->a[k];
        assert( k>=0 && k<pSrc->nSrc );
        if( pItem->zDatabase ){
          sqlite3StrAccumAppend(pAccum, pItem->zDatabase, -1);
          sqlite3StrAccumAppend(pAccum, ".", 1);
        }
        sqlite3StrAccumAppend(pAccum, pItem->zName, -1);
        length = width = 0;
        break;
      }
      default: {
        assert( xtype==etINVALID );
        return;
      }
    }/* End switch over the format type */
    /*
    ** The text of the conversion is pointed to by "bufpt" and is
    ** "length" characters long.  The field width is "width".  Do
    ** the output.
    */
    if( !flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        sqlite3AppendSpace(pAccum, nspace);
      }
    }
    if( length>0 ){
      sqlite3StrAccumAppend(pAccum, bufpt, length);
    }
    if( flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        sqlite3AppendSpace(pAccum, nspace);
      }
    }
    sqlite3_free(zExtra);
  }/* End for loop over the format string */
}